

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandFactoryArgumentList_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
          *params,set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *skippedParams,bool definition,bool singular)

{
  string *psVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  allocator<char> local_9a;
  allocator<char> local_99;
  string *local_98;
  VulkanHppGenerator *local_90;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = __return_storage_ptr__;
  local_90 = this;
  for (local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_dataplus._M_p <
      (pointer)(((long)(params->
                       super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(params->
                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x108);
      local_88._M_dataplus._M_p = local_88._M_dataplus._M_p + 1) {
    bVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            contains(skippedParams,(key_type *)&local_88);
    if (!bVar2) {
      generateRAIIHandleConstructorArgument_abi_cxx11_
                (&local_50,local_90,
                 (params->
                 super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)local_88._M_dataplus._M_p,
                 definition,singular,false);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_68,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,", ",&local_9a);
  psVar1 = local_98;
  anon_unknown.dwarf_dd40c::generateList(local_98,&local_68,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return psVar1;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandFactoryArgumentList( std::vector<ParamData> const & params,
                                                                              std::set<size_t> const &       skippedParams,
                                                                              bool                           definition,
                                                                              bool                           singular ) const
{
  std::vector<std::string> arguments;
  for ( size_t i = 0; i < params.size(); ++i )
  {
    if ( !skippedParams.contains( i ) )
    {
      arguments.push_back( generateRAIIHandleConstructorArgument( params[i], definition, singular, false ) );
    }
  }
  return generateList( arguments, "", ", " );
}